

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O2

String * __thiscall
kj::anon_unknown_0::percentDecodeQuery
          (String *__return_storage_ptr__,anon_unknown_0 *this,ArrayPtr<const_char> text,
          bool *hadErrors,Options *options)

{
  ArrayPtr<const_char> text_00;
  EncodingResult<kj::String> result;
  anon_unknown_0 *local_48;
  ArrayPtr<const_char> *local_40;
  EncodingResult<kj::String> local_38;
  
  text_00.size_ = (ArrayPtr<const_char> *)text.ptr;
  local_48 = this;
  local_40 = text_00.size_;
  if (*hadErrors == true) {
    text_00.ptr = (char *)this;
    decodeWwwForm(&local_38,text_00);
    if (local_38.hadErrors == true) {
      *(undefined1 *)text.size_ = 1;
    }
    (__return_storage_ptr__->content).ptr = local_38.super_String.content.ptr;
    (__return_storage_ptr__->content).size_ = local_38.super_String.content.size_;
    (__return_storage_ptr__->content).disposer = local_38.super_String.content.disposer;
    local_38.super_String.content.ptr = (char *)0x0;
    local_38.super_String.content.size_ = 0;
    Array<char>::~Array((Array<char> *)&local_38);
  }
  else {
    str<kj::ArrayPtr<char_const>&>(__return_storage_ptr__,(kj *)&local_48,text_00.size_);
  }
  return __return_storage_ptr__;
}

Assistant:

String percentDecodeQuery(ArrayPtr<const char> text, bool& hadErrors, const Url::Options& options) {
  if (options.percentDecode) {
    auto result = decodeWwwForm(text);
    if (result.hadErrors) hadErrors = true;
    return kj::mv(result);
  }
  return kj::str(text);
}